

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  OfType OVar2;
  ulong uVar3;
  ostream *this_00;
  AssertionResult *in_RSI;
  ostream *in_RDI;
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionPrinter *in_stack_000000b0;
  AssertionResult *in_stack_ffffffffffffff90;
  ColourImpl *colourImpl_;
  undefined7 in_stack_ffffffffffffffa0;
  AssertionPrinter *in_stack_ffffffffffffffb0;
  undefined1 local_19;
  
  local_19 = 1;
  uVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))();
  if (((uVar3 & 1) == 0) && (bVar1 = AssertionResult::isOk(in_stack_ffffffffffffff90), bVar1)) {
    OVar2 = AssertionResult::getResultType(in_RSI);
    if ((OVar2 != Warning) &&
       (OVar2 = AssertionResult::getResultType(in_RSI), OVar2 != ExplicitSkip)) {
      return;
    }
    local_19 = 0;
  }
  colourImpl_ = *(ColourImpl **)(in_RDI + 0x20);
  Detail::unique_ptr<Catch::ColourImpl>::get((unique_ptr<Catch::ColourImpl> *)(in_RDI + 0x28));
  anon_unknown_26::AssertionPrinter::AssertionPrinter
            (in_stack_ffffffffffffffb0,in_RDI,
             (AssertionStats *)CONCAT17(local_19,in_stack_ffffffffffffffa0),
             SUB81((ulong)in_RSI >> 0x38,0),colourImpl_);
  anon_unknown_26::AssertionPrinter::print(in_stack_000000b0);
  this_00 = std::operator<<(*(ostream **)(in_RDI + 0x20),'\n');
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip )
                    return;
                printInfoMessages = false;
            }

            AssertionPrinter printer( m_stream, _assertionStats, printInfoMessages, m_colour.get() );
            printer.print();

            m_stream << '\n' << std::flush;
        }